

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O0

QHttpNetworkRequest __thiscall
QHttpNetworkConnectionPrivate::predictNextRequest(QHttpNetworkConnectionPrivate *this)

{
  long lVar1;
  bool bVar2;
  totally_ordered_wrapper<QHttpNetworkRequestPrivate_*> extraout_RDX;
  totally_ordered_wrapper<QHttpNetworkRequestPrivate_*> extraout_RDX_00;
  totally_ordered_wrapper<QHttpNetworkRequestPrivate_*> extraout_RDX_01;
  QSharedDataPointer<QHttpNetworkRequestPrivate> QVar3;
  undefined8 in_RSI;
  QHttpNetworkRequest *in_RDI;
  long in_FS_OFFSET;
  QHttpNetworkRequest QVar4;
  QHttpNetworkHeader this_00;
  QHttpNetworkRequest *url;
  QUrl in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._vptr_QHttpNetworkHeader = (_func_int **)in_RDI;
  url = in_RDI;
  bVar2 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::isEmpty
                    ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2eea22);
  if (bVar2) {
    bVar2 = QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::isEmpty
                      ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)0x2eea56);
    if (bVar2) {
      QUrl::QUrl((QUrl *)&stack0xfffffffffffffff0);
      QHttpNetworkRequest::QHttpNetworkRequest
                ((QHttpNetworkRequest *)in_stack_fffffffffffffff0.d,(QUrl *)url,
                 (Operation)((ulong)in_RSI >> 0x20),(Priority)in_RSI);
      QUrl::~QUrl((QUrl *)&stack0xfffffffffffffff0);
      QVar3.d.ptr = (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)
                    (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)extraout_RDX_01.ptr;
    }
    else {
      QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::last
                ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)in_RDI);
      QHttpNetworkRequest::QHttpNetworkRequest
                ((QHttpNetworkRequest *)this_00._vptr_QHttpNetworkHeader,in_RDI);
      QVar3.d.ptr = (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)
                    (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)extraout_RDX_00.ptr;
    }
  }
  else {
    QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::last
              ((QList<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)in_RDI);
    QHttpNetworkRequest::QHttpNetworkRequest
              ((QHttpNetworkRequest *)this_00._vptr_QHttpNetworkHeader,in_RDI);
    QVar3.d.ptr = (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)
                  (totally_ordered_wrapper<QHttpNetworkRequestPrivate_*>)extraout_RDX.ptr;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar4.d.d.ptr = QVar3.d.ptr;
    QVar4.super_QHttpNetworkHeader._vptr_QHttpNetworkHeader = this_00._vptr_QHttpNetworkHeader;
    return QVar4;
  }
  __stack_chk_fail();
}

Assistant:

QHttpNetworkRequest QHttpNetworkConnectionPrivate::predictNextRequest() const
{
    if (!highPriorityQueue.isEmpty())
        return highPriorityQueue.last().first;
    if (!lowPriorityQueue.isEmpty())
        return lowPriorityQueue.last().first;
    return QHttpNetworkRequest();
}